

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

bool __thiscall GraphPropagator::propagate(GraphPropagator *this)

{
  BoolView *pBVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  uVar3 = (this->vs).sz;
  if (0 < (int)uVar3) {
    lVar5 = 0xc;
    lVar6 = 0;
    pcVar4 = sat.assigns.data;
    do {
      pBVar1 = (this->vs).data;
      if ((pcVar4[*(uint *)((long)pBVar1 + lVar5 + -4)] != '\0') &&
         ((uint)*(byte *)((long)&(pBVar1->super_Var).super_Branching._vptr_Branching + lVar5) * 2 +
          -1 == (int)pcVar4[*(uint *)((long)pBVar1 + lVar5 + -4)])) {
        bVar2 = coherence_outedges(this,(int)lVar6);
        if (!bVar2) {
          return false;
        }
        uVar3 = (this->vs).sz;
        pcVar4 = sat.assigns.data;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < (int)uVar3);
  }
  uVar3 = (this->es).sz;
  if (0 < (int)uVar3) {
    lVar5 = 0xc;
    lVar6 = 0;
    pcVar4 = sat.assigns.data;
    do {
      pBVar1 = (this->es).data;
      if ((pcVar4[*(uint *)((long)pBVar1 + lVar5 + -4)] != '\0') &&
         ((uint)*(byte *)((long)&(pBVar1->super_Var).super_Branching._vptr_Branching + lVar5) * -2 +
          1 == (int)pcVar4[*(uint *)((long)pBVar1 + lVar5 + -4)])) {
        bVar2 = coherence_innodes(this,(int)lVar6);
        if (!bVar2) {
          return false;
        }
        uVar3 = (this->es).sz;
        pcVar4 = sat.assigns.data;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < (int)uVar3);
  }
  return true;
}

Assistant:

bool GraphPropagator::propagate() {
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed() && getNodeVar(i).isFalse()) {
			if (!coherence_outedges(i)) {
				return false;
			}
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed() && getEdgeVar(i).isTrue()) {
			if (!coherence_innodes(i)) {
				return false;
			}
		}
	}
	return true;
}